

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  undefined8 *puVar1;
  uint *puVar2;
  int iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  pointer pnVar6;
  pointer pnVar7;
  Real RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  type_conflict5 tVar14;
  double *pdVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  ulong uVar17;
  Item *pIVar18;
  long lVar19;
  long lVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_808 [12];
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  int local_7e0;
  bool local_7dc;
  fpclass_type local_7d8;
  int32_t iStack_7d4;
  cpp_dec_float<50U,_int,_void> local_7c8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_790;
  undefined1 local_788 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_780;
  uint local_778 [3];
  undefined3 uStack_76b;
  uint local_768;
  undefined3 uStack_763;
  int local_760;
  bool local_75c;
  undefined8 local_758;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_750;
  cpp_dec_float<50U,_int,_void> local_748;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_710;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6f8;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6e0;
  cpp_dec_float<50U,_int,_void> local_6c8;
  cpp_dec_float<50U,_int,_void> local_688;
  cpp_dec_float<50U,_int,_void> local_648;
  cpp_dec_float<50U,_int,_void> local_608;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  ulong local_590;
  double local_588;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_580;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_568;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_550;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_538;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_520;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_508;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  cpp_dec_float<50U,_int,_void> local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  cpp_dec_float<50U,_int,_void> local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  cpp_dec_float<50U,_int,_void> local_1f0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_550,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_568,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_580,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_6e0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_6f8,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_710,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_5c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_5c8.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_5c8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_5c8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_5c8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_6c8.exp =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.exp;
  local_6c8.neg =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.neg;
  local_6c8.fpclass =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.fpclass;
  local_6c8.prec_elem =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.prec_elem;
  local_648.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_648.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_648.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_648.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_648.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_688.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_688.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_688.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_688.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_688.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_6c8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_6c8.data._M_elems[0] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0];
  local_6c8.data._M_elems[1] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[1];
  local_6c8.data._M_elems[2] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[2];
  local_6c8.data._M_elems[3] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[3];
  local_6c8.data._M_elems[4] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[4];
  local_6c8.data._M_elems[5] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[5];
  local_6c8.data._M_elems[6] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[6];
  local_6c8.data._M_elems[7] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[7];
  local_688.exp = local_6c8.exp;
  local_688.neg = local_6c8.neg;
  local_688.fpclass = local_6c8.fpclass;
  local_688.prec_elem = local_6c8.prec_elem;
  local_648.exp = local_6c8.exp;
  local_648.neg = local_6c8.neg;
  local_648.fpclass = local_6c8.fpclass;
  local_648.prec_elem = local_6c8.prec_elem;
  local_5c8.m_backend.exp = local_6c8.exp;
  local_5c8.m_backend.neg = local_6c8.neg;
  local_5c8.m_backend.fpclass = local_6c8.fpclass;
  local_5c8.m_backend.prec_elem = local_6c8.prec_elem;
  pdVar15 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_748,*pdVar15,(type *)0x0);
  local_788 = (undefined1  [8])&DAT_3ff0000000000000;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_7c8,this);
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems._24_5_ = 0;
  local_2d8.data._M_elems[7]._1_3_ = 0;
  local_2d8.data._M_elems._32_5_ = 0;
  local_2d8._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&local_2d8,(double *)local_788,&local_7c8);
  pdVar15 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_d8,*pdVar15,(type *)0x0);
  local_790 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_808,local_790);
  RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_808._4_4_,local_808._0_4_));
  bVar12 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_2d8,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_d8,RVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_808 + 8));
  if (bVar12) {
    local_788 = (undefined1  [8])&DAT_3ff0000000000000;
    feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_808,this);
    local_7c8.fpclass = cpp_dec_float_finite;
    local_7c8.prec_elem = 10;
    local_7c8.data._M_elems[0] = 0;
    local_7c8.data._M_elems[1] = 0;
    local_7c8.data._M_elems[2] = 0;
    local_7c8.data._M_elems[3] = 0;
    local_7c8.data._M_elems[4] = 0;
    local_7c8.data._M_elems[5] = 0;
    local_7c8.data._M_elems[6] = 0;
    local_7c8.data._M_elems[7] = 0;
    local_7c8.data._M_elems[8] = 0;
    local_7c8.data._M_elems[9] = 0;
    local_7c8.exp = 0;
    local_7c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&local_7c8,(double *)local_788,(cpp_dec_float<50U,_int,_void> *)local_808);
    local_748.data._M_elems[8] = local_7c8.data._M_elems[8];
    local_748.data._M_elems[9] = local_7c8.data._M_elems[9];
    local_748.data._M_elems[4] = local_7c8.data._M_elems[4];
    local_748.data._M_elems[5] = local_7c8.data._M_elems[5];
    local_748.data._M_elems[6] = local_7c8.data._M_elems[6];
    local_748.data._M_elems[7] = local_7c8.data._M_elems[7];
    local_748.data._M_elems[0] = local_7c8.data._M_elems[0];
    local_748.data._M_elems[1] = local_7c8.data._M_elems[1];
    local_748.data._M_elems[2] = local_7c8.data._M_elems[2];
    local_748.data._M_elems[3] = local_7c8.data._M_elems[3];
    local_748.exp = local_7c8.exp;
    local_748.neg = local_7c8.neg;
    local_748.fpclass = local_7c8.fpclass;
    local_748.prec_elem = local_7c8.prec_elem;
  }
  bVar12 = true;
  uVar17 = (ulong)(uint)(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum;
  local_750 = lp;
  do {
    if ((int)uVar17 < 1) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_4f0,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_568);
      bVar13 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)&local_4f0);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_4f0);
      if (bVar13) {
        tVar14 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_648,&this->m_cutoffbound);
        if (tVar14) {
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
               local_648.data._M_elems._32_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
               local_648.data._M_elems._16_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
               local_648.data._M_elems._24_8_;
          *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems =
               local_648.data._M_elems._0_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
               local_648.data._M_elems._8_8_;
          (this->m_cutoffbound).m_backend.exp = local_648.exp;
          (this->m_cutoffbound).m_backend.neg = local_648.neg;
          (this->m_cutoffbound).m_backend.fpclass = local_648.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = local_648.prec_elem;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_508,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_580);
      bVar13 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)&local_508);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_508);
      if (bVar13) {
        tVar14 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_688,&this->m_cutoffbound);
        if (tVar14) {
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
               local_688.data._M_elems._32_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
               local_688.data._M_elems._16_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
               local_688.data._M_elems._24_8_;
          *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems =
               local_688.data._M_elems._0_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
               local_688.data._M_elems._8_8_;
          (this->m_cutoffbound).m_backend.exp = local_688.exp;
          (this->m_cutoffbound).m_backend.neg = local_688.neg;
          (this->m_cutoffbound).m_backend.fpclass = local_688.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = local_688.prec_elem;
        }
      }
      if (bVar12) {
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)&local_520,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)&local_550);
        bVar12 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)&local_520);
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base(&local_520);
        if (bVar12) {
          tVar14 = boost::multiprecision::operator>(&local_5c8,&this->m_cutoffbound);
          if (tVar14) {
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
                 local_5c8.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
                 local_5c8.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
                 local_5c8.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems =
                 local_5c8.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
                 local_5c8.m_backend.data._M_elems._8_8_;
            (this->m_cutoffbound).m_backend.exp = local_5c8.m_backend.exp;
            (this->m_cutoffbound).m_backend.neg = local_5c8.m_backend.neg;
            (this->m_cutoffbound).m_backend.fpclass = local_5c8.m_backend.fpclass;
            (this->m_cutoffbound).m_backend.prec_elem = local_5c8.m_backend.prec_elem;
          }
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_538,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_6e0);
      bVar12 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)&local_538);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_538);
      if (bVar12) {
        tVar14 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_6c8,&this->m_cutoffbound);
        if (tVar14) {
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
               local_6c8.data._M_elems._32_8_;
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
               CONCAT44(local_6c8.data._M_elems[5],local_6c8.data._M_elems[4]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
               CONCAT44(local_6c8.data._M_elems[7],local_6c8.data._M_elems[6]);
          *(ulong *)(this->m_cutoffbound).m_backend.data._M_elems =
               CONCAT44(local_6c8.data._M_elems[1],local_6c8.data._M_elems[0]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
               CONCAT44(local_6c8.data._M_elems[3],local_6c8.data._M_elems[2]);
          (this->m_cutoffbound).m_backend.exp = local_6c8.exp;
          (this->m_cutoffbound).m_backend.neg = local_6c8.neg;
          (this->m_cutoffbound).m_backend.fpclass = local_6c8.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = local_6c8.prec_elem;
        }
      }
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_710);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_6f8);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_6e0);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_580);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_568);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_550);
      return;
    }
    uVar17 = uVar17 - 1;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&local_6f8._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&local_710._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend,0);
    pIVar18 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[uVar17].idx;
    lVar19 = 0;
    local_590 = uVar17;
    for (lVar20 = 0; lp = local_750,
        lVar20 < (pIVar18->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar20 = lVar20 + 1) {
      pNVar4 = (pIVar18->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      uVar5 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar19 + 0x20);
      local_7c8.data._M_elems[8] = (uint)uVar5;
      local_7c8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar19);
      uVar5 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar19 + 0x10);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      local_7c8.data._M_elems[4] = (uint)uVar10;
      local_7c8.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
      local_7c8.data._M_elems[6] = (uint)uVar11;
      local_7c8.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
      local_7c8.data._M_elems[0] = (uint)uVar5;
      local_7c8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
      local_7c8.data._M_elems[2] = (uint)uVar9;
      local_7c8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
      local_7c8.exp = *(int *)((long)&(pNVar4->val).m_backend.data + lVar19 + 0x28);
      local_7c8.neg = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar19 + 0x2c);
      local_7c8._48_8_ = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar19 + 0x30);
      iVar3 = *(int *)((long)(&((pIVar18->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val + 1) + lVar19);
      pnVar6 = (local_750->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_318.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar6[iVar3].m_backend.data + 0x20);
      pnVar7 = pnVar6 + iVar3;
      local_318.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      local_318.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
      local_318.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
      local_318.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
      puVar2 = (uint *)((long)&pnVar6[iVar3].m_backend.data + 0x10);
      local_318.m_backend.data._M_elems[4] = *puVar2;
      local_318.m_backend.data._M_elems[5] = puVar2[1];
      local_318.m_backend.data._M_elems[6] = puVar2[2];
      local_318.m_backend.data._M_elems[7] = puVar2[3];
      local_318.m_backend.exp = pnVar6[iVar3].m_backend.exp;
      local_318.m_backend.neg = pnVar6[iVar3].m_backend.neg;
      local_318.m_backend.fpclass = pnVar6[iVar3].m_backend.fpclass;
      local_318.m_backend.prec_elem = pnVar6[iVar3].m_backend.prec_elem;
      pdVar15 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_110,-*pdVar15,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_808,local_790
                );
      RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_808._4_4_,local_808._0_4_));
      bVar13 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_318,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_110,RVar8);
      if (bVar13) {
        iVar3 = *(int *)((long)(&((pIVar18->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar19);
        pnVar6 = (local_750->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_358.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar6[iVar3].m_backend.data + 0x20);
        pnVar7 = pnVar6 + iVar3;
        local_358.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        local_358.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
        local_358.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
        local_358.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
        puVar2 = (uint *)((long)&pnVar6[iVar3].m_backend.data + 0x10);
        local_358.m_backend.data._M_elems[4] = *puVar2;
        local_358.m_backend.data._M_elems[5] = puVar2[1];
        local_358.m_backend.data._M_elems[6] = puVar2[2];
        local_358.m_backend.data._M_elems[7] = puVar2[3];
        local_358.m_backend.exp = pnVar6[iVar3].m_backend.exp;
        local_358.m_backend.neg = pnVar6[iVar3].m_backend.neg;
        local_358.m_backend.fpclass = pnVar6[iVar3].m_backend.fpclass;
        local_358.m_backend.prec_elem = pnVar6[iVar3].m_backend.prec_elem;
        pdVar15 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_148,*pdVar15,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_788,
                   local_790);
        RVar8 = Tolerances::epsilon((Tolerances *)local_788);
        bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_358,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148,RVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_780);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_808 + 8));
        if (!bVar13) goto LAB_0029fc7d;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_808,local_6f8._M_impl.super__Vector_impl_data._M_start + uVar17,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_808,local_710._M_impl.super__Vector_impl_data._M_start + uVar17,0);
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_808 + 8));
LAB_0029fc7d:
        iVar3 = *(int *)((long)(&((pIVar18->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar19);
        pnVar6 = (local_750->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_398.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar6[iVar3].m_backend.data + 0x20);
        pnVar7 = pnVar6 + iVar3;
        local_398.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        local_398.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
        local_398.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
        local_398.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
        puVar2 = (uint *)((long)&pnVar6[iVar3].m_backend.data + 0x10);
        local_398.m_backend.data._M_elems[4] = *puVar2;
        local_398.m_backend.data._M_elems[5] = puVar2[1];
        local_398.m_backend.data._M_elems[6] = puVar2[2];
        local_398.m_backend.data._M_elems[7] = puVar2[3];
        local_398.m_backend.exp = pnVar6[iVar3].m_backend.exp;
        local_398.m_backend.neg = pnVar6[iVar3].m_backend.neg;
        local_398.m_backend.fpclass = pnVar6[iVar3].m_backend.fpclass;
        local_398.m_backend.prec_elem = pnVar6[iVar3].m_backend.prec_elem;
        pdVar15 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_180,-*pdVar15,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_808,
                   local_790);
        RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_808._4_4_,local_808._0_4_));
        bVar13 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_398,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_180,RVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_808 + 8));
        if (bVar13) {
          local_808._0_4_ = 0;
          tVar14 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_7c8,(int *)local_808);
          if (tVar14) {
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_808,local_710._M_impl.super__Vector_impl_data._M_start + uVar17,0)
            ;
          }
          else {
            local_808._0_4_ = 0;
            tVar14 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_7c8,(int *)local_808);
            if (tVar14) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_808,local_6f8._M_impl.super__Vector_impl_data._M_start + uVar17,
                           0);
            }
          }
        }
        else {
          iVar3 = *(int *)((long)(&((pIVar18->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar19);
          pnVar6 = (local_750->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_3d8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar6[iVar3].m_backend.data + 0x20);
          pnVar7 = pnVar6 + iVar3;
          local_3d8.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
          local_3d8.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
          local_3d8.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
          local_3d8.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
          puVar2 = (uint *)((long)&pnVar6[iVar3].m_backend.data + 0x10);
          local_3d8.m_backend.data._M_elems[4] = *puVar2;
          local_3d8.m_backend.data._M_elems[5] = puVar2[1];
          local_3d8.m_backend.data._M_elems[6] = puVar2[2];
          local_3d8.m_backend.data._M_elems[7] = puVar2[3];
          local_3d8.m_backend.exp = pnVar6[iVar3].m_backend.exp;
          local_3d8.m_backend.neg = pnVar6[iVar3].m_backend.neg;
          local_3d8.m_backend.fpclass = pnVar6[iVar3].m_backend.fpclass;
          local_3d8.m_backend.prec_elem = pnVar6[iVar3].m_backend.prec_elem;
          pdVar15 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_1b8,*pdVar15,(type *)0x0);
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_808,
                     local_790);
          RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_808._4_4_,local_808._0_4_));
          bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_3d8,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1b8,RVar8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_808 + 8));
          if (bVar13) {
            local_808._0_4_ = 0;
            tVar14 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_7c8,(int *)local_808);
            if (tVar14) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_808,local_6f8._M_impl.super__Vector_impl_data._M_start + uVar17,
                           0);
            }
            else {
              local_808._0_4_ = 0;
              tVar14 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_7c8,(int *)local_808);
              if (tVar14) {
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_808,
                             local_710._M_impl.super__Vector_impl_data._M_start + uVar17,0);
              }
            }
          }
        }
      }
      lVar19 = lVar19 + 0x3c;
    }
    pnVar7 = (local_750->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_4d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pnVar7[uVar17].m_backend.data + 0x20);
    local_7c8.data._M_elems[8] = local_4d8.m_backend.data._M_elems[8];
    local_7c8.data._M_elems[9] = local_4d8.m_backend.data._M_elems[9];
    uVar5 = *(undefined8 *)&pnVar7[uVar17].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar7[uVar17].m_backend.data + 8);
    puVar2 = (uint *)((long)&pnVar7[uVar17].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar2;
    uVar11 = *(undefined8 *)(puVar2 + 2);
    local_7c8.data._M_elems[4] = (uint)uVar10;
    local_7c8.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
    local_7c8.data._M_elems[6] = (uint)uVar11;
    local_7c8.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
    local_7c8.data._M_elems[0] = (uint)uVar5;
    local_7c8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
    local_7c8.data._M_elems[2] = (uint)uVar9;
    local_7c8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
    local_7c8.exp = pnVar7[uVar17].m_backend.exp;
    local_7c8.neg = pnVar7[uVar17].m_backend.neg;
    local_4d8.m_backend.fpclass = pnVar7[uVar17].m_backend.fpclass;
    local_4d8.m_backend.prec_elem = pnVar7[uVar17].m_backend.prec_elem;
    local_7c8.prec_elem = local_4d8.m_backend.prec_elem;
    local_7c8.fpclass = local_4d8.m_backend.fpclass;
    pnVar7 = (local_750->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = *(undefined8 *)((long)&pnVar7[uVar17].m_backend.data + 0x20);
    local_7e8 = (uint)uVar5;
    uStack_7e4 = (uint)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)&pnVar7[uVar17].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar7[uVar17].m_backend.data + 8);
    puVar2 = (uint *)((long)&pnVar7[uVar17].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar2;
    uVar11 = *(undefined8 *)(puVar2 + 2);
    local_7f8 = (uint)uVar10;
    uStack_7f4 = (uint)((ulong)uVar10 >> 0x20);
    uStack_7f0 = (uint)uVar11;
    uStack_7ec = (uint)((ulong)uVar11 >> 0x20);
    local_808._0_4_ = (undefined4)uVar5;
    local_808._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    local_808._8_4_ = (undefined4)uVar9;
    uStack_7fc = (uint)((ulong)uVar9 >> 0x20);
    local_7e0 = pnVar7[uVar17].m_backend.exp;
    local_7dc = pnVar7[uVar17].m_backend.neg;
    local_7d8 = pnVar7[uVar17].m_backend.fpclass;
    iStack_7d4 = pnVar7[uVar17].m_backend.prec_elem;
    local_4d8.m_backend.data._M_elems[0] = local_7c8.data._M_elems[0];
    local_4d8.m_backend.data._M_elems[1] = local_7c8.data._M_elems[1];
    local_4d8.m_backend.data._M_elems[2] = local_7c8.data._M_elems[2];
    local_4d8.m_backend.data._M_elems[3] = local_7c8.data._M_elems[3];
    local_4d8.m_backend.data._M_elems[4] = local_7c8.data._M_elems[4];
    local_4d8.m_backend.data._M_elems[5] = local_7c8.data._M_elems[5];
    local_4d8.m_backend.data._M_elems[6] = local_7c8.data._M_elems[6];
    local_4d8.m_backend.data._M_elems[7] = local_7c8.data._M_elems[7];
    local_4d8.m_backend.exp = local_7c8.exp;
    local_4d8.m_backend.neg = local_7c8.neg;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_68,-*pdVar15,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_788,local_790);
    RVar8 = Tolerances::epsilon((Tolerances *)local_788);
    bVar13 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_4d8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_68,RVar8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_780);
    if (bVar13) {
      local_788 = (undefined1  [8])CONCAT44(local_748.data._M_elems[1],local_748.data._M_elems[0]);
      _Stack_780._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_748.data._M_elems[3],local_748.data._M_elems[2]);
      local_778[1] = local_748.data._M_elems[5];
      local_778[0] = local_748.data._M_elems[4];
      _local_768 = (undefined5)CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]);
      uStack_763 = (undefined3)(local_748.data._M_elems[9] >> 8);
      stack0xfffffffffffff890 =
           (undefined5)CONCAT44(local_748.data._M_elems[7],local_748.data._M_elems[6]);
      uStack_76b = (undefined3)(local_748.data._M_elems[7] >> 8);
      local_760 = local_748.exp;
      local_75c = local_748.neg;
      local_758._0_4_ = local_748.fpclass;
      local_758._4_4_ = local_748.prec_elem;
      if (local_748.fpclass != cpp_dec_float_finite || local_748.data._M_elems[0] != 0) {
        local_75c = (bool)(local_748.neg ^ 1);
      }
      tVar14 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_788,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_808);
      if (tVar14) {
        local_608.data._M_elems[1] = local_748.data._M_elems[2];
        local_608.data._M_elems[0] = local_748.data._M_elems[1];
        local_608.data._M_elems[3] = local_748.data._M_elems[4];
        local_608.data._M_elems[2] = local_748.data._M_elems[3];
        local_608.data._M_elems[5] = local_748.data._M_elems[6];
        local_608.data._M_elems[4] = local_748.data._M_elems[5];
        local_608.data._M_elems._24_5_ =
             SUB85(CONCAT44(local_748.data._M_elems[8],local_748.data._M_elems[7]),0);
        local_608.data._M_elems[7]._1_3_ = (undefined3)(local_748.data._M_elems[8] >> 8);
        local_608.data._M_elems[8] = local_748.data._M_elems[9];
        local_7c8.exp = local_748.exp;
        local_7c8.prec_elem = local_748.prec_elem;
        if (local_748.fpclass == cpp_dec_float_finite && local_748.data._M_elems[0] == 0) {
          local_7c8.neg = local_748.neg;
          local_7c8.data._M_elems[0] = 0;
          local_7c8.fpclass = cpp_dec_float_finite;
        }
        else {
          local_7c8.neg = (bool)(local_748.neg ^ 1);
          local_7c8.data._M_elems[0] = local_748.data._M_elems[0];
          local_7c8.fpclass = local_748.fpclass;
        }
      }
      else {
        local_608.data._M_elems[1] = local_808._8_4_;
        local_608.data._M_elems[0] = local_808._4_4_;
        local_608.data._M_elems[3] = local_7f8;
        local_608.data._M_elems[2] = uStack_7fc;
        local_608.data._M_elems[5] = uStack_7f0;
        local_608.data._M_elems[4] = uStack_7f4;
        local_608.data._M_elems._24_5_ = SUB85(CONCAT44(local_7e8,uStack_7ec),0);
        local_608.data._M_elems[7]._1_3_ = (undefined3)(local_7e8 >> 8);
        local_608.data._M_elems[8] = uStack_7e4;
        local_7c8.exp = local_7e0;
        local_7c8.neg = local_7dc;
        local_7c8.prec_elem = iStack_7d4;
        local_7c8.data._M_elems[0] = local_808._0_4_;
        local_7c8.fpclass = local_7d8;
      }
      local_7c8.data._M_elems[9] = local_608.data._M_elems[8];
      local_7c8.data._M_elems[5] = local_608.data._M_elems[4];
      local_7c8.data._M_elems[6] = local_608.data._M_elems[5];
      local_7c8.data._M_elems[7] = local_608.data._M_elems[6];
      local_7c8.data._M_elems[8] =
           (uint)(CONCAT35(local_608.data._M_elems[7]._1_3_,local_608.data._M_elems._24_5_) >> 0x20)
      ;
      local_7c8.data._M_elems[1] = local_608.data._M_elems[0];
      local_7c8.data._M_elems[2] = local_608.data._M_elems[1];
      local_7c8.data._M_elems[3] = local_608.data._M_elems[2];
      local_7c8.data._M_elems[4] = local_608.data._M_elems[3];
    }
    local_418.m_backend.data._M_elems[9] = uStack_7e4;
    local_418.m_backend.data._M_elems[8] = local_7e8;
    local_418.m_backend.data._M_elems[4] = local_7f8;
    local_418.m_backend.data._M_elems[5] = uStack_7f4;
    local_418.m_backend.data._M_elems[6] = uStack_7f0;
    local_418.m_backend.data._M_elems[7] = uStack_7ec;
    local_418.m_backend.data._M_elems[0] = local_808._0_4_;
    local_418.m_backend.data._M_elems[1] = local_808._4_4_;
    local_418.m_backend.data._M_elems[2] = local_808._8_4_;
    local_418.m_backend.data._M_elems[3] = uStack_7fc;
    local_418.m_backend.exp = local_7e0;
    local_418.m_backend.neg = local_7dc;
    local_418.m_backend.fpclass = local_7d8;
    local_418.m_backend.prec_elem = iStack_7d4;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,*pdVar15,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_788,local_790);
    RVar8 = Tolerances::epsilon((Tolerances *)local_788);
    bVar13 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_418,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_a0,RVar8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_780);
    if (bVar13) {
      tVar14 = boost::multiprecision::operator>
                         ((lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar17,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_748);
      pcVar16 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend;
      if (!tVar14) {
        pcVar16 = &local_748;
      }
      uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
      local_7e8 = (uint)uVar5;
      uStack_7e4 = (uint)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(pcVar16->data)._M_elems;
      uVar9 = *(undefined8 *)((pcVar16->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
      uVar11 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
      local_7f8 = (uint)uVar10;
      uStack_7f4 = (uint)((ulong)uVar10 >> 0x20);
      uStack_7f0 = (uint)uVar11;
      uStack_7ec = (uint)((ulong)uVar11 >> 0x20);
      local_808._0_4_ = (undefined4)uVar5;
      local_808._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      local_808._8_4_ = (undefined4)uVar9;
      uStack_7fc = (uint)((ulong)uVar9 >> 0x20);
      local_7e0 = pcVar16->exp;
      local_7dc = pcVar16->neg;
      local_7d8 = pcVar16->fpclass;
      iStack_7d4 = pcVar16->prec_elem;
    }
    if (bVar12) {
      local_458.m_backend.data._M_elems[9] = local_7c8.data._M_elems[9];
      local_458.m_backend.data._M_elems[8] = local_7c8.data._M_elems[8];
      local_458.m_backend.data._M_elems[1] = local_7c8.data._M_elems[1];
      local_458.m_backend.data._M_elems[0] = local_7c8.data._M_elems[0];
      local_458.m_backend.data._M_elems[3] = local_7c8.data._M_elems[3];
      local_458.m_backend.data._M_elems[2] = local_7c8.data._M_elems[2];
      local_458.m_backend.data._M_elems[5] = local_7c8.data._M_elems[5];
      local_458.m_backend.data._M_elems[4] = local_7c8.data._M_elems[4];
      local_458.m_backend.data._M_elems[7] = local_7c8.data._M_elems[7];
      local_458.m_backend.data._M_elems[6] = local_7c8.data._M_elems[6];
      local_458.m_backend.exp = local_7c8.exp;
      local_458.m_backend.neg = local_7c8.neg;
      local_458.m_backend.fpclass = local_7c8.fpclass;
      local_458.m_backend.prec_elem = local_7c8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_1f0,0.0,(type *)0x0);
      feastol(&local_228,this);
      bVar13 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_458,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1f0,&local_228);
      if (bVar13) {
        local_498.m_backend.data._M_elems[9] = uStack_7e4;
        local_498.m_backend.data._M_elems[8] = local_7e8;
        local_498.m_backend.data._M_elems[1] = local_808._4_4_;
        local_498.m_backend.data._M_elems[0] = local_808._0_4_;
        local_498.m_backend.data._M_elems[3] = uStack_7fc;
        local_498.m_backend.data._M_elems[2] = local_808._8_4_;
        local_498.m_backend.data._M_elems[5] = uStack_7f4;
        local_498.m_backend.data._M_elems[4] = local_7f8;
        local_498.m_backend.data._M_elems[7] = uStack_7ec;
        local_498.m_backend.data._M_elems[6] = uStack_7f0;
        local_498.m_backend.exp = local_7e0;
        local_498.m_backend.neg = local_7dc;
        local_498.m_backend.fpclass = local_7d8;
        local_498.m_backend.prec_elem = iStack_7d4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_260,0.0,(type *)0x0);
        feastol(&local_298,this);
        bVar13 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_498,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_260,&local_298);
        if (bVar13) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     (local_550._M_impl.super__Vector_impl_data._M_start + uVar17),0.0);
          goto LAB_002a0406;
        }
      }
      bVar12 = false;
    }
LAB_002a0406:
    *(ulong *)(local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems +
              8) = CONCAT44(local_7c8.data._M_elems[9],local_7c8.data._M_elems[8]);
    puVar2 = local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems + 4;
    *(ulong *)puVar2 = CONCAT44(local_7c8.data._M_elems[5],local_7c8.data._M_elems[4]);
    *(ulong *)(puVar2 + 2) = CONCAT44(local_7c8.data._M_elems[7],local_7c8.data._M_elems[6]);
    *(ulong *)local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems =
         CONCAT44(local_7c8.data._M_elems[1],local_7c8.data._M_elems[0]);
    *(ulong *)(local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems +
              2) = CONCAT44(local_7c8.data._M_elems[3],local_7c8.data._M_elems[2]);
    local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.exp = local_7c8.exp;
    local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.neg = local_7c8.neg;
    local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.fpclass = local_7c8.fpclass
    ;
    local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.prec_elem =
         local_7c8.prec_elem;
    *(ulong *)(local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems +
              8) = CONCAT44(uStack_7e4,local_7e8);
    puVar2 = local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems + 4;
    *(ulong *)puVar2 = CONCAT44(uStack_7f4,local_7f8);
    *(ulong *)(puVar2 + 2) = CONCAT44(uStack_7ec,uStack_7f0);
    *(ulong *)local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems =
         CONCAT44(local_808._4_4_,local_808._0_4_);
    *(ulong *)(local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems +
              2) = CONCAT44(uStack_7fc,local_808._8_4_);
    local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.exp = local_7e0;
    local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.neg = local_7dc;
    local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.fpclass = local_7d8;
    local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.prec_elem = iStack_7d4;
    tVar14 = boost::multiprecision::operator>
                       (local_710._M_impl.super__Vector_impl_data._M_start + uVar17,
                        local_6f8._M_impl.super__Vector_impl_data._M_start + uVar17);
    if (tVar14) {
      *(ulong *)(local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems
                + 8) = CONCAT44(uStack_7e4,local_7e8);
      puVar2 = local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems +
               4;
      *(ulong *)puVar2 = CONCAT44(uStack_7f4,local_7f8);
      *(ulong *)(puVar2 + 2) = CONCAT44(uStack_7ec,uStack_7f0);
      *(ulong *)local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems =
           CONCAT44(local_808._4_4_,local_808._0_4_);
      *(ulong *)(local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems
                + 2) = CONCAT44(uStack_7fc,local_808._8_4_);
      local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.exp = local_7e0;
      local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.neg = local_7dc;
      local_758 = _local_7d8;
    }
    else {
      tVar14 = boost::multiprecision::operator<
                         (local_710._M_impl.super__Vector_impl_data._M_start + uVar17,
                          local_6f8._M_impl.super__Vector_impl_data._M_start + uVar17);
      if (tVar14) {
        *(ulong *)(local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data.
                   _M_elems + 8) = CONCAT44(local_7c8.data._M_elems[9],local_7c8.data._M_elems[8]);
        puVar2 = local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems
                 + 4;
        *(ulong *)puVar2 = CONCAT44(local_7c8.data._M_elems[5],local_7c8.data._M_elems[4]);
        *(ulong *)(puVar2 + 2) = CONCAT44(local_7c8.data._M_elems[7],local_7c8.data._M_elems[6]);
        *(ulong *)local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems
             = CONCAT44(local_7c8.data._M_elems[1],local_7c8.data._M_elems[0]);
        *(ulong *)(local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data.
                   _M_elems + 2) = CONCAT44(local_7c8.data._M_elems[3],local_7c8.data._M_elems[2]);
        local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.exp = local_7c8.exp;
        local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.neg = local_7c8.neg;
        local_758 = local_7c8._48_8_;
      }
      else {
        local_608.fpclass = cpp_dec_float_finite;
        local_608.prec_elem = 10;
        local_608.data._M_elems[0] = 0;
        local_608.data._M_elems[1] = 0;
        local_608.data._M_elems[2] = 0;
        local_608.data._M_elems[3] = 0;
        local_608.data._M_elems[4] = 0;
        local_608.data._M_elems[5] = 0;
        local_608.data._M_elems._24_5_ = 0;
        local_608.data._M_elems[7]._1_3_ = 0;
        local_608.data._M_elems[8] = 0;
        local_608.data._M_elems[9]._0_1_ = 0;
        local_608._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_608,&local_7c8,(cpp_dec_float<50U,_int,_void> *)local_808);
        local_588 = 2.0;
        local_758._0_4_ = cpp_dec_float_finite;
        local_758._4_4_ = 10;
        local_788 = (undefined1  [8])0x0;
        _Stack_780._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_778[0] = 0;
        local_778[1] = 0;
        stack0xfffffffffffff890 = 0;
        uStack_76b = 0;
        _local_768 = 0;
        uStack_763 = 0;
        local_760 = 0;
        local_75c = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  ((cpp_dec_float<50U,_int,_void> *)local_788,&local_608,&local_588);
        *(ulong *)(local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data.
                   _M_elems + 8) = CONCAT35(uStack_763,_local_768);
        puVar2 = local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems
                 + 4;
        *(undefined8 *)puVar2 = local_778._0_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_76b,stack0xfffffffffffff890);
        *(undefined1 (*) [8])
         local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems =
             local_788;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.data._M_elems + 2) =
             _Stack_780._M_pi;
        local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.exp = local_760;
        local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.neg = local_75c;
      }
    }
    local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.fpclass =
         (fpclass_type)local_758;
    local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend.prec_elem =
         SUB84(local_758,4);
    local_758._0_4_ = cpp_dec_float_finite;
    local_758._4_4_ = 10;
    local_788 = (undefined1  [8])0x0;
    _Stack_780._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_778[0] = 0;
    local_778[1] = 0;
    stack0xfffffffffffff890 = 0;
    uStack_76b = 0;
    _local_768 = 0;
    uStack_763 = 0;
    local_760 = 0;
    local_75c = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_788,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend,
               &local_568._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&local_648,(cpp_dec_float<50U,_int,_void> *)local_788);
    local_758._0_4_ = cpp_dec_float_finite;
    local_758._4_4_ = 10;
    local_788 = (undefined1  [8])0x0;
    _Stack_780._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_778[0] = 0;
    local_778[1] = 0;
    stack0xfffffffffffff890 = 0;
    uStack_76b = 0;
    _local_768 = 0;
    uStack_763 = 0;
    local_760 = 0;
    local_75c = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_788,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend,
               &local_580._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&local_688,(cpp_dec_float<50U,_int,_void> *)local_788);
    local_758._0_4_ = cpp_dec_float_finite;
    local_758._4_4_ = 10;
    local_788 = (undefined1  [8])0x0;
    _Stack_780._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_778[0] = 0;
    local_778[1] = 0;
    stack0xfffffffffffff890 = 0;
    uStack_76b = 0;
    _local_768 = 0;
    uStack_763 = 0;
    local_760 = 0;
    local_75c = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_788,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend,
               &local_6e0._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&local_6c8,(cpp_dec_float<50U,_int,_void> *)local_788);
    uVar17 = local_590;
  } while( true );
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}